

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_suite_name,TestInfo *test_info)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  TimeInMillis ms;
  TimeInMillis ms_00;
  _Alloc_hider _Var3;
  char *pcVar4;
  undefined1 local_90 [8];
  string kTestsuite;
  string local_50;
  int local_30;
  allocator local_29;
  
  std::__cxx11::string::string((string *)local_90,"testcase",(allocator *)&local_50);
  if (test_info->is_in_another_shard_ == false) {
    std::operator<<(stream,"    <testcase");
    std::__cxx11::string::string((string *)&local_50,"name",(allocator *)&local_30);
    std::__cxx11::string::string
              ((string *)(kTestsuite.field_2._M_local_buf + 8),(test_info->name_)._M_dataplus._M_p,
               &local_29);
    OutputXmlAttribute(stream,(string *)local_90,&local_50,(string *)((long)&kTestsuite.field_2 + 8)
                      );
    std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_50);
    pbVar1 = (test_info->value_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
       ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
      std::__cxx11::string::string((string *)&local_50,"value_param",(allocator *)&local_30);
      pbVar1 = (test_info->value_param_)._M_t.
               super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
      if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        _Var3._M_p = (char *)0x0;
      }
      else {
        _Var3._M_p = (pbVar1->_M_dataplus)._M_p;
      }
      std::__cxx11::string::string
                ((string *)(kTestsuite.field_2._M_local_buf + 8),_Var3._M_p,&local_29);
      OutputXmlAttribute(stream,(string *)local_90,&local_50,
                         (string *)((long)&kTestsuite.field_2 + 8));
      std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_50);
    }
    pbVar1 = (test_info->type_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
       ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
      std::__cxx11::string::string((string *)&local_50,"type_param",(allocator *)&local_30);
      pbVar1 = (test_info->type_param_)._M_t.
               super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
      if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        _Var3._M_p = (char *)0x0;
      }
      else {
        _Var3._M_p = (pbVar1->_M_dataplus)._M_p;
      }
      std::__cxx11::string::string
                ((string *)(kTestsuite.field_2._M_local_buf + 8),_Var3._M_p,&local_29);
      OutputXmlAttribute(stream,(string *)local_90,&local_50,
                         (string *)((long)&kTestsuite.field_2 + 8));
      std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (FLAGS_gtest_list_tests == '\x01') {
      std::__cxx11::string::string((string *)&local_50,"file",(allocator *)&local_30);
      std::__cxx11::string::string
                ((string *)(kTestsuite.field_2._M_local_buf + 8),
                 (test_info->location_).file._M_dataplus._M_p,&local_29);
      OutputXmlAttribute(stream,(string *)local_90,&local_50,
                         (string *)((long)&kTestsuite.field_2 + 8));
      std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string((string *)&local_50,"line",&local_29);
      local_30 = (test_info->location_).line;
      StreamableToString<int>((string *)((long)&kTestsuite.field_2 + 8),&local_30);
      OutputXmlAttribute(stream,(string *)local_90,&local_50,
                         (string *)((long)&kTestsuite.field_2 + 8));
      std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_50);
      std::operator<<(stream," />\n");
    }
    else {
      std::__cxx11::string::string((string *)&local_50,"status",(allocator *)&local_30);
      pcVar4 = "notrun";
      if (test_info->should_run_ != false) {
        pcVar4 = "run";
      }
      std::__cxx11::string::string((string *)(kTestsuite.field_2._M_local_buf + 8),pcVar4,&local_29)
      ;
      OutputXmlAttribute(stream,(string *)local_90,&local_50,
                         (string *)((long)&kTestsuite.field_2 + 8));
      std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string((string *)&local_50,"result",(allocator *)&local_30);
      if (test_info->should_run_ == true) {
        bVar2 = TestResult::Skipped(&test_info->result_);
        pcVar4 = "completed";
        if (bVar2) {
          pcVar4 = "skipped";
        }
      }
      else {
        pcVar4 = "suppressed";
      }
      std::__cxx11::string::string((string *)(kTestsuite.field_2._M_local_buf + 8),pcVar4,&local_29)
      ;
      OutputXmlAttribute(stream,(string *)local_90,&local_50,
                         (string *)((long)&kTestsuite.field_2 + 8));
      std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string((string *)&local_50,"time",(allocator *)&local_30);
      FormatTimeInMillisAsSeconds_abi_cxx11_
                ((string *)((long)&kTestsuite.field_2 + 8),
                 (internal *)(test_info->result_).elapsed_time_,ms);
      OutputXmlAttribute(stream,(string *)local_90,&local_50,
                         (string *)((long)&kTestsuite.field_2 + 8));
      std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string((string *)&local_50,"timestamp",(allocator *)&local_30);
      FormatEpochTimeInMillisAsIso8601_abi_cxx11_
                ((string *)((long)&kTestsuite.field_2 + 8),
                 (internal *)(test_info->result_).start_timestamp_,ms_00);
      OutputXmlAttribute(stream,(string *)local_90,&local_50,
                         (string *)((long)&kTestsuite.field_2 + 8));
      std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string((string *)&local_50,"classname",(allocator *)&local_30);
      std::__cxx11::string::string
                ((string *)(kTestsuite.field_2._M_local_buf + 8),test_suite_name,&local_29);
      OutputXmlAttribute(stream,(string *)local_90,&local_50,
                         (string *)((long)&kTestsuite.field_2 + 8));
      std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_50);
      OutputXmlTestResult(stream,&test_info->result_);
    }
  }
  std::__cxx11::string::~string((string *)local_90);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_suite_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestsuite = "testcase";

  if (test_info.is_in_another_shard()) {
    return;
  }

  *stream << "    <testcase";
  OutputXmlAttribute(stream, kTestsuite, "name", test_info.name());

  if (test_info.value_param() != nullptr) {
    OutputXmlAttribute(stream, kTestsuite, "value_param",
                       test_info.value_param());
  }
  if (test_info.type_param() != nullptr) {
    OutputXmlAttribute(stream, kTestsuite, "type_param",
                       test_info.type_param());
  }
  if (GTEST_FLAG(list_tests)) {
    OutputXmlAttribute(stream, kTestsuite, "file", test_info.file());
    OutputXmlAttribute(stream, kTestsuite, "line",
                       StreamableToString(test_info.line()));
    *stream << " />\n";
    return;
  }

  OutputXmlAttribute(stream, kTestsuite, "status",
                     test_info.should_run() ? "run" : "notrun");
  OutputXmlAttribute(stream, kTestsuite, "result",
                     test_info.should_run()
                         ? (result.Skipped() ? "skipped" : "completed")
                         : "suppressed");
  OutputXmlAttribute(stream, kTestsuite, "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(
      stream, kTestsuite, "timestamp",
      FormatEpochTimeInMillisAsIso8601(result.start_timestamp()));
  OutputXmlAttribute(stream, kTestsuite, "classname", test_suite_name);

  OutputXmlTestResult(stream, result);
}